

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall Matrix::append(Matrix *this,QpVector *vec)

{
  HighsInt *pHVar1;
  ulong in_RAX;
  HighsInt i;
  long lVar2;
  long lVar3;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (((this->mat).num_col == 0) &&
     ((this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    local_38 = in_RAX & 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&(this->mat).start,(int *)((long)&local_38 + 4));
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < vec->num_nz; lVar2 = lVar2 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (&(this->mat).index,
               (value_type_conflict2 *)
               ((long)(vec->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar3));
    std::vector<double,_std::allocator<double>_>::push_back
              (&(this->mat).value,
               (vec->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start +
               *(int *)((long)(vec->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 4;
  }
  local_38 = CONCAT44(local_38._4_4_,
                      vec->num_nz +
                      (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(this->mat).num_col]);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&(this->mat).start,(int *)&local_38);
  pHVar1 = &(this->mat).num_col;
  *pHVar1 = *pHVar1 + 1;
  this->has_transpose = false;
  return;
}

Assistant:

void append(const QpVector& vec) {
    if (mat.num_col == 0 && mat.start.size() == 0) {
      mat.start.push_back(0);
    }
    for (HighsInt i = 0; i < vec.num_nz; i++) {
      mat.index.push_back(vec.index[i]);
      mat.value.push_back(vec.value[vec.index[i]]);
    }
    mat.start.push_back(mat.start[mat.num_col] + vec.num_nz);
    mat.num_col++;
    has_transpose = false;
  }